

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder.h
# Opt level: O0

void mf_read(lzma_mf *mf,uint8_t *out,size_t *out_pos,size_t out_size,size_t *left)

{
  size_t local_48;
  size_t copy_size;
  size_t out_avail;
  size_t *left_local;
  size_t out_size_local;
  size_t *out_pos_local;
  uint8_t *out_local;
  lzma_mf *mf_local;
  
  local_48 = out_size - *out_pos;
  if (*left <= local_48) {
    local_48 = *left;
  }
  if (mf->read_ahead != 0) {
    __assert_fail("mf->read_ahead == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/lz/lz_encoder.h"
                  ,0x11d,"void mf_read(lzma_mf *, uint8_t *, size_t *, size_t, size_t *)");
  }
  if ((ulong)mf->read_pos < *left) {
    __assert_fail("mf->read_pos >= *left",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/lz/lz_encoder.h"
                  ,0x11e,"void mf_read(lzma_mf *, uint8_t *, size_t *, size_t, size_t *)");
  }
  memcpy(out + *out_pos,mf->buffer + ((ulong)mf->read_pos - *left),local_48);
  *out_pos = local_48 + *out_pos;
  *left = *left - local_48;
  return;
}

Assistant:

static inline void
mf_read(lzma_mf *mf, uint8_t *out, size_t *out_pos, size_t out_size,
		size_t *left)
{
	const size_t out_avail = out_size - *out_pos;
	const size_t copy_size = my_min(out_avail, *left);

	assert(mf->read_ahead == 0);
	assert(mf->read_pos >= *left);

	memcpy(out + *out_pos, mf->buffer + mf->read_pos - *left,
			copy_size);

	*out_pos += copy_size;
	*left -= copy_size;
	return;
}